

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::fair::detail::timed_mutex_impl::
impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex_impl *this,unique_lock<std::mutex> *lk,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  cv_status cVar2;
  undefined1 local_38 [8];
  node request;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  unique_lock<std::mutex> *lk_local;
  timed_mutex_impl *this_local;
  
  request.prev = (node *)tp;
  bVar1 = wq_empty(this);
  if (bVar1) {
    wq_push_back(this,&this->locked_);
  }
  else {
    wq_push_back(this,(node *)local_38);
    do {
      if ((this->queue_).next == (node *)local_38) goto LAB_00137b2d;
      cVar2 = std::condition_variable::
              wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->cv_,lk,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)request.prev);
    } while (cVar2 != timeout);
    if ((this->queue_).next != (node *)local_38) {
      wq_erase(this,(node *)local_38);
      return false;
    }
LAB_00137b2d:
    wq_replace_front(this,&this->locked_);
  }
  return true;
}

Assistant:

bool impl_try_lockwait(std::unique_lock<std::mutex>& lk, const std::chrono::time_point<Clock, Duration>& tp)
  {
    if (!wq_empty()) {
      node request;
      wq_push_back(&request);
      while (queue_.next != &request) {
        if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
          if (queue_.next == &request)  // re-check predicate
            break;
          wq_erase(&request);
          return false;
        }
      }
      wq_replace_front(&locked_);
    } else {
      wq_push_back(&locked_);
    }
    return true;
  }